

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O0

t_int * powtodb_tilde_perform(t_int *w)

{
  double dVar1;
  float local_30;
  t_sample g;
  t_sample f;
  int n;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  out = (t_sample *)w[1];
  _f = (float *)w[2];
  g = (t_sample)w[3];
  while (g != 0.0) {
    if (0.0 < *out) {
      dVar1 = log((double)*out);
      local_30 = (float)(dVar1 * 4.3429448190325175 + 100.0);
      if (local_30 < 0.0) {
        local_30 = 0.0;
      }
      *_f = local_30;
    }
    else {
      *_f = 0.0;
    }
    out = out + 1;
    _f = _f + 1;
    g = (t_sample)((int)g + -1);
  }
  return w + 4;
}

Assistant:

static t_int *powtodb_tilde_perform(t_int *w)
{
    t_sample *in = (t_sample *)w[1], *out = (t_sample *)w[2];
    int n = (int)w[3];
    for (; n--; in++, out++)
    {
        t_sample f = *in;
        if (f <= 0) *out = 0;
        else
        {
            t_sample g = 100 + 10./LOGTEN * log(f);
            *out = (g < 0 ? 0 : g);
        }
    }
    return (w + 4);
}